

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::SingleArena_GetSet_Test::~SingleArena_GetSet_Test(SingleArena_GetSet_Test *this)

{
  ~SingleArena_GetSet_Test
            ((SingleArena_GetSet_Test *)
             &this[-1].super_SingleArena.super_TestWithParam<bool>.super_Test.gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(SingleArena, GetSet) {
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitDefault();
  EXPECT_EQ("", field.Get());
  field.Set("Test short", arena.get());
  EXPECT_EQ("Test short", field.Get());
  field.Set("Test long long long long value", arena.get());
  EXPECT_EQ("Test long long long long value", field.Get());
  field.Set("", arena.get());
  field.Destroy();
}